

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O3

int __thiscall Fl_Browser_::select_only(Fl_Browser_ *this,void *item,int docallbacks)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  fd_set *in_R8;
  timeval *in_R9;
  uint uVar4;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_30;
  void *pvVar3;
  
  if (item == (void *)0x0) {
    iVar1 = deselect(this,docallbacks);
    return iVar1;
  }
  Fl_Widget_Tracker::Fl_Widget_Tracker(&local_30,(Fl_Widget *)this);
  uVar4 = 0;
  if ((this->super_Fl_Group).super_Fl_Widget.type_ == '\x03') {
    iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
    uVar4 = 0;
    pvVar3 = (void *)CONCAT44(extraout_var,iVar1);
    while (pvVar3 != (void *)0x0) {
      if (pvVar3 != item) {
        uVar2 = select(this,(int)pvVar3,(fd_set *)0x0,(fd_set *)(ulong)(uint)docallbacks,in_R8,in_R9
                      );
        uVar4 = uVar4 | uVar2;
      }
      if (local_30.wp_ == (Fl_Widget *)0x0) goto LAB_001b6763;
      iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar3);
      pvVar3 = (void *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  uVar2 = select(this,(int)item,(fd_set *)0x1,(fd_set *)(ulong)(uint)docallbacks,in_R8,in_R9);
  uVar4 = uVar2 | uVar4;
  if (local_30.wp_ != (Fl_Widget *)0x0) {
    display(this,item);
  }
LAB_001b6763:
  Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_30);
  return uVar4;
}

Assistant:

int Fl_Browser_::select_only(void* item, int docallbacks) {
  if (!item) return deselect(docallbacks);
  int change = 0;
  Fl_Widget_Tracker wp(this);
  if (type() == FL_MULTI_BROWSER) {
    for (void* p = item_first(); p; p = item_next(p)) {
      if (p != item) change |= select(p, 0, docallbacks);
      if (wp.deleted()) return change;
    }
  }
  change |= select(item, 1, docallbacks);
  if (wp.deleted()) return change;
  display(item);
  return change;
}